

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeparser_p.h
# Opt level: O2

void __thiscall
QDateTimeParser::QDateTimeParser
          (QDateTimeParser *this,undefined4 t,undefined4 ctx,undefined8 param_4)

{
  *(code **)this = QGuiApplication::primaryScreen;
  *(undefined8 *)(this + 8) = 0x76cffffffff;
  *(undefined8 *)(this + 0x10) = 0xffffffff00000000;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  *(undefined8 *)(this + 0x40) = 0;
  *(undefined8 *)(this + 0x48) = 0;
  *(undefined8 *)(this + 0x50) = 0;
  *(undefined8 *)(this + 0x58) = 0;
  *(undefined8 *)(this + 0x60) = 0;
  *(undefined8 *)(this + 0x68) = 0;
  *(undefined8 *)(this + 0x70) = 0;
  QLocale::system();
  *(undefined4 *)(this + 0x80) = t;
  this[0x84] = (QDateTimeParser)0x0;
  *(undefined4 *)(this + 0x88) = ctx;
  *(undefined8 *)(this + 0x90) = param_4;
  return;
}

Assistant:

QDateTimeParser(QMetaType::Type t, Context ctx, QCalendar cal = QCalendar())
        : defaultLocale(QLocale::system()), parserType(t), context(ctx), calendar(cal)
    {
    }